

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void __thiscall
tchecker::clockbounds::global_lu_map_t::resize(global_lu_map_t *this,clock_id_t clock_nb)

{
  undefined1 auVar1 [16];
  map_t *pmVar2;
  map_t *pmVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  
  clear(this);
  this->_clock_nb = clock_nb;
  pmVar2 = allocate_map((ulong)clock_nb);
  this->_L = pmVar2;
  pmVar3 = allocate_map((ulong)this->_clock_nb);
  this->_U = pmVar3;
  auVar1 = _DAT_001d5360;
  pmVar2 = this->_L;
  uVar4 = (ulong)(pmVar2->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar4 != 0) {
    lVar9 = uVar4 - 1;
    auVar6._8_4_ = (int)lVar9;
    auVar6._0_8_ = lVar9;
    auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_001d5360;
    auVar13 = _DAT_001d6a50;
    auVar10 = _DAT_001d5350;
    do {
      auVar12 = auVar10 ^ auVar1;
      iVar8 = auVar6._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar8 && auVar6._0_4_ < auVar12._0_4_ || iVar8 < auVar12._4_4_)
                & 1)) {
        *(undefined4 *)(&(pmVar2->_fam).field_0x0 + uVar5) = 0xc0000001;
      }
      if ((auVar12._12_4_ != auVar6._12_4_ || auVar12._8_4_ <= auVar6._8_4_) &&
          auVar12._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)&pmVar2[1].super_array_capacity_t<unsigned_int>._capacity + uVar5) =
             0xc0000001;
      }
      auVar12 = auVar13 ^ auVar1;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar8 && (iVar14 != iVar8 || auVar12._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)(&pmVar2[1]._fam.field_0x0 + uVar5) = 0xc0000001;
        *(undefined4 *)((long)&pmVar2[2].super_array_capacity_t<unsigned_int>._capacity + uVar5) =
             0xc0000001;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar9 + 4;
      uVar5 = uVar5 + 0x10;
    } while ((uVar4 * 4 + 0xc & 0xfffffffffffffff0) != uVar5);
  }
  auVar1 = _DAT_001d5360;
  uVar4 = (ulong)(pmVar3->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar4 != 0) {
    lVar9 = uVar4 - 1;
    auVar7._8_4_ = (int)lVar9;
    auVar7._0_8_ = lVar9;
    auVar7._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_001d5360;
    auVar12 = _DAT_001d6a50;
    auVar11 = _DAT_001d5350;
    do {
      auVar13 = auVar11 ^ auVar1;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar8 && auVar7._0_4_ < auVar13._0_4_ || iVar8 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)(&(pmVar3->_fam).field_0x0 + uVar5) = 0xc0000001;
      }
      if ((auVar13._12_4_ != auVar7._12_4_ || auVar13._8_4_ <= auVar7._8_4_) &&
          auVar13._12_4_ <= auVar7._12_4_) {
        *(undefined4 *)((long)&pmVar3[1].super_array_capacity_t<unsigned_int>._capacity + uVar5) =
             0xc0000001;
      }
      auVar13 = auVar12 ^ auVar1;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar8 && (iVar14 != iVar8 || auVar13._0_4_ <= auVar7._0_4_)) {
        *(undefined4 *)(&pmVar3[1]._fam.field_0x0 + uVar5) = 0xc0000001;
        *(undefined4 *)((long)&pmVar3[2].super_array_capacity_t<unsigned_int>._capacity + uVar5) =
             0xc0000001;
      }
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar9 + 4;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar9 + 4;
      uVar5 = uVar5 + 0x10;
    } while ((uVar4 * 4 + 0xc & 0xfffffffffffffff0) != uVar5);
  }
  return;
}

Assistant:

void global_lu_map_t::resize(tchecker::clock_id_t clock_nb)
{
  clear();

  _clock_nb = clock_nb;
  _L = tchecker::clockbounds::allocate_map(_clock_nb);
  _U = tchecker::clockbounds::allocate_map(_clock_nb);
  tchecker::clockbounds::clear(*_L);
  tchecker::clockbounds::clear(*_U);
}